

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3RunParser(Parse *pParse,char *zSql,char **pzErrMsg)

{
  ushort uVar1;
  short sVar2;
  AutoincInfo *p;
  Table *pTable;
  sqlite3 *db;
  Parse *pPVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  ushort *puVar8;
  ushort uVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  uchar local_d08;
  uint local_d04;
  sqlite3 *local_d00;
  char **local_cf8;
  uchar *local_cf0;
  uint local_ce8;
  YYMINORTYPE local_ce0;
  yyParser sEngine;
  
  local_d00 = pParse->db;
  iVar14 = local_d00->aLimit[1];
  if (local_d00->nVdbeActive == 0) {
    (local_d00->u1).isInterrupted = 0;
  }
  pParse->rc = 0;
  pParse->zTail = zSql;
  sEngine.yytos = sEngine.yystack;
  sEngine.yystack[0].stateno = 0;
  sEngine.yystack[0].major = '\0';
  sEngine.yystackEnd = sEngine.yystack + 99;
  uVar6 = 0xffffffff;
  uVar4 = 0;
  local_cf8 = pzErrMsg;
LAB_0011d1a7:
  if (*zSql == '\0') {
    uVar13 = 0;
    if (uVar6 != 1) {
      if (uVar6 == 0) goto LAB_0011d404;
      uVar13 = 1;
    }
    zSql = (char *)((uchar *)zSql + -(long)(int)uVar4);
    local_d04 = uVar13;
LAB_0011d22c:
    uVar6 = local_d04;
    (pParse->sLastToken).z = zSql;
    (pParse->sLastToken).n = uVar4;
    sEngine.pParse = pParse;
    do {
      pPVar3 = sEngine.pParse;
      uVar1 = (sEngine.yytos)->stateno;
      uVar7 = (ulong)uVar1;
      local_d08 = (uchar)uVar6;
      if (uVar7 < 0x3e1) {
        sVar2 = yy_shift_ofst[uVar7];
        uVar12 = (ulong)uVar6;
        do {
          uVar11 = uVar12 & 0xff;
          uVar13 = (int)uVar11 + (int)sVar2;
          bVar10 = (byte)uVar12;
          if ((uVar13 < 0x61d) && (yy_lookahead[uVar13] == bVar10)) {
            puVar8 = yy_action + uVar13;
            goto LAB_0011d2ec;
          }
        } while ((bVar10 < 0x45) && (uVar12 = (ulong)""[uVar11], ""[uVar11] != 0));
        if (((sVar2 < 0x5d8) && (((uVar1 != 0x68 && (uVar1 != 0xe0)) && (bVar10 != 0)))) &&
           (uVar13 = (int)sVar2 + 0x45, yy_lookahead[uVar13] == 'E')) {
          puVar8 = yy_action + uVar13;
        }
        else {
          puVar8 = yy_default + uVar7;
        }
LAB_0011d2ec:
        uVar1 = *puVar8;
        uVar7 = (ulong)uVar1;
        if (uVar1 < 0x3e1) {
          if (sEngine.yystackEnd < sEngine.yytos + 1) {
            yyStackOverflow(&sEngine);
          }
          else {
            uVar9 = uVar1 + 0x149;
            if (uVar1 < 0x1c7) {
              uVar9 = uVar1;
            }
            sEngine.yytos[1].stateno = uVar9;
            sEngine.yytos[1].major = local_d08;
            sEngine.yytos[1].minor.yy0.z = zSql;
            sEngine.yytos[1].minor.yy0.n = uVar4;
            sEngine.yytos = sEngine.yytos + 1;
          }
          break;
        }
      }
      if (0x529 < (ushort)uVar7) {
        local_cf0 = (uchar *)zSql;
        local_ce8 = uVar4;
        local_ce0.yy72 = (Expr *)zSql;
        local_ce0.yy0.n = uVar4;
        sqlite3ErrorMsg(sEngine.pParse,"near \"%T\": syntax error",&local_cf0);
        sEngine.pParse = pPVar3;
        yy_destructor(&sEngine,local_d08,&local_ce0);
        break;
      }
      yy_reduce(&sEngine,(int)uVar7 - 0x3e1);
    } while (sEngine.yystack < sEngine.yytos);
    zSql = (char *)((uchar *)zSql + (int)uVar4);
    if ((pParse->rc != 0) || (local_d00->mallocFailed != '\0')) goto LAB_0011d404;
    goto LAB_0011d1a7;
  }
  uVar4 = sqlite3GetToken((uchar *)zSql,(int *)&local_d04);
  iVar14 = iVar14 - uVar4;
  if (-1 < iVar14) {
    if (0xa2 < (int)local_d04) {
      if ((local_d00->u1).isInterrupted != 0) {
        pParse->rc = 9;
        goto LAB_0011d404;
      }
      if (local_d04 == 0xa4) {
        sqlite3ErrorMsg(pParse,"unrecognized token: \"%.*s\"",(ulong)uVar4,zSql);
        goto LAB_0011d404;
      }
      zSql = (char *)((uchar *)zSql + (int)uVar4);
      goto LAB_0011d1a7;
    }
    goto LAB_0011d22c;
  }
  pParse->rc = 0x12;
LAB_0011d404:
  db = local_d00;
  pParse->zTail = zSql;
  while (sEngine.yystack < sEngine.yytos) {
    yy_pop_parser_stack(&sEngine);
  }
  if (db->mallocFailed == '\0') {
    iVar14 = pParse->rc;
    if ((iVar14 == 0) || (iVar14 == 0x65)) goto LAB_0011d46e;
  }
  else {
    pParse->rc = 7;
    iVar14 = 7;
  }
  if (pParse->zErrMsg == (char *)0x0) {
    pcVar5 = sqlite3ErrStr(iVar14);
    pcVar5 = sqlite3MPrintf(db,"%s",pcVar5);
    pParse->zErrMsg = pcVar5;
  }
LAB_0011d46e:
  pcVar5 = pParse->zErrMsg;
  if (pcVar5 != (char *)0x0) {
    *local_cf8 = pcVar5;
    sqlite3_log(pParse->rc,"%s");
    pParse->zErrMsg = (char *)0x0;
  }
  if (((pParse->pVdbe != (Vdbe *)0x0) && (0 < pParse->nErr)) && (pParse->nested == '\0')) {
    sqlite3VdbeDelete(pParse->pVdbe);
    pParse->pVdbe = (Vdbe *)0x0;
  }
  if (pParse->nested == '\0') {
    sqlite3DbFree(db,pParse->aTableLock);
    pParse->aTableLock = (TableLock *)0x0;
    pParse->nTableLock = 0;
  }
  sqlite3_free(pParse->apVtabLock);
  if (pParse->declareVtab == '\0') {
    sqlite3DeleteTable(db,pParse->pNewTable);
  }
  if (pParse->pWithToFree != (With *)0x0) {
    sqlite3WithDelete(db,pParse->pWithToFree);
  }
  sqlite3DeleteTrigger(db,pParse->pNewTrigger);
  sqlite3DbFree(db,pParse->pVList);
  while (p = pParse->pAinc, p != (AutoincInfo *)0x0) {
    pParse->pAinc = p->pNext;
    sqlite3DbFreeNN(db,p);
  }
  while (pTable = pParse->pZombieTab, pTable != (Table *)0x0) {
    pParse->pZombieTab = pTable->pNextZombie;
    sqlite3DeleteTable(db,pTable);
  }
  return (uint)(pcVar5 != (char *)0x0);
}

Assistant:

SQLITE_PRIVATE int sqlite3RunParser(Parse *pParse, const char *zSql, char **pzErrMsg){
  int nErr = 0;                   /* Number of errors encountered */
  void *pEngine;                  /* The LEMON-generated LALR(1) parser */
  int n = 0;                      /* Length of the next token token */
  int tokenType;                  /* type of the next token */
  int lastTokenParsed = -1;       /* type of the previous token */
  sqlite3 *db = pParse->db;       /* The database connection */
  int mxSqlLen;                   /* Max length of an SQL string */
#ifdef sqlite3Parser_ENGINEALWAYSONSTACK
  yyParser sEngine;    /* Space to hold the Lemon-generated Parser object */
#endif

  assert( zSql!=0 );
  mxSqlLen = db->aLimit[SQLITE_LIMIT_SQL_LENGTH];
  if( db->nVdbeActive==0 ){
    db->u1.isInterrupted = 0;
  }
  pParse->rc = SQLITE_OK;
  pParse->zTail = zSql;
  assert( pzErrMsg!=0 );
  /* sqlite3ParserTrace(stdout, "parser: "); */
#ifdef sqlite3Parser_ENGINEALWAYSONSTACK
  pEngine = &sEngine;
  sqlite3ParserInit(pEngine);
#else
  pEngine = sqlite3ParserAlloc(sqlite3Malloc);
  if( pEngine==0 ){
    sqlite3OomFault(db);
    return SQLITE_NOMEM_BKPT;
  }
#endif
  assert( pParse->pNewTable==0 );
  assert( pParse->pNewTrigger==0 );
  assert( pParse->nVar==0 );
  assert( pParse->pVList==0 );
  while( 1 ){
    if( zSql[0]!=0 ){
      n = sqlite3GetToken((u8*)zSql, &tokenType);
      mxSqlLen -= n;
      if( mxSqlLen<0 ){
        pParse->rc = SQLITE_TOOBIG;
        break;
      }
    }else{
      /* Upon reaching the end of input, call the parser two more times
      ** with tokens TK_SEMI and 0, in that order. */
      if( lastTokenParsed==TK_SEMI ){
        tokenType = 0;
      }else if( lastTokenParsed==0 ){
        break;
      }else{
        tokenType = TK_SEMI;
      }
      zSql -= n;
    }
    if( tokenType>=TK_SPACE ){
      assert( tokenType==TK_SPACE || tokenType==TK_ILLEGAL );
      if( db->u1.isInterrupted ){
        pParse->rc = SQLITE_INTERRUPT;
        break;
      }
      if( tokenType==TK_ILLEGAL ){
        sqlite3ErrorMsg(pParse, "unrecognized token: \"%.*s\"", n, zSql);
        break;
      }
      zSql += n;
    }else{
      pParse->sLastToken.z = zSql;
      pParse->sLastToken.n = n;
      sqlite3Parser(pEngine, tokenType, pParse->sLastToken, pParse);
      lastTokenParsed = tokenType;
      zSql += n;
      if( pParse->rc!=SQLITE_OK || db->mallocFailed ) break;
    }
  }
  assert( nErr==0 );
  pParse->zTail = zSql;
#ifdef YYTRACKMAXSTACKDEPTH
  sqlite3_mutex_enter(sqlite3MallocMutex());
  sqlite3StatusHighwater(SQLITE_STATUS_PARSER_STACK,
      sqlite3ParserStackPeak(pEngine)
  );
  sqlite3_mutex_leave(sqlite3MallocMutex());
#endif /* YYDEBUG */
#ifdef sqlite3Parser_ENGINEALWAYSONSTACK
  sqlite3ParserFinalize(pEngine);
#else
  sqlite3ParserFree(pEngine, sqlite3_free);
#endif
  if( db->mallocFailed ){
    pParse->rc = SQLITE_NOMEM_BKPT;
  }
  if( pParse->rc!=SQLITE_OK && pParse->rc!=SQLITE_DONE && pParse->zErrMsg==0 ){
    pParse->zErrMsg = sqlite3MPrintf(db, "%s", sqlite3ErrStr(pParse->rc));
  }
  assert( pzErrMsg!=0 );
  if( pParse->zErrMsg ){
    *pzErrMsg = pParse->zErrMsg;
    sqlite3_log(pParse->rc, "%s", *pzErrMsg);
    pParse->zErrMsg = 0;
    nErr++;
  }
  if( pParse->pVdbe && pParse->nErr>0 && pParse->nested==0 ){
    sqlite3VdbeDelete(pParse->pVdbe);
    pParse->pVdbe = 0;
  }
#ifndef SQLITE_OMIT_SHARED_CACHE
  if( pParse->nested==0 ){
    sqlite3DbFree(db, pParse->aTableLock);
    pParse->aTableLock = 0;
    pParse->nTableLock = 0;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  sqlite3_free(pParse->apVtabLock);
#endif

  if( !IN_DECLARE_VTAB ){
    /* If the pParse->declareVtab flag is set, do not delete any table 
    ** structure built up in pParse->pNewTable. The calling code (see vtab.c)
    ** will take responsibility for freeing the Table structure.
    */
    sqlite3DeleteTable(db, pParse->pNewTable);
  }

  if( pParse->pWithToFree ) sqlite3WithDelete(db, pParse->pWithToFree);
  sqlite3DeleteTrigger(db, pParse->pNewTrigger);
  sqlite3DbFree(db, pParse->pVList);
  while( pParse->pAinc ){
    AutoincInfo *p = pParse->pAinc;
    pParse->pAinc = p->pNext;
    sqlite3DbFreeNN(db, p);
  }
  while( pParse->pZombieTab ){
    Table *p = pParse->pZombieTab;
    pParse->pZombieTab = p->pNextZombie;
    sqlite3DeleteTable(db, p);
  }
  assert( nErr==0 || pParse->rc!=SQLITE_OK );
  return nErr;
}